

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

SampledSpectrum pbrt::FrConductor(Float cosTheta_i,SampledSpectrum *eta,SampledSpectrum *k)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  SampledSpectrum SVar29;
  SampledSpectrum ret_1;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  undefined1 local_18 [16];
  
  auVar23._4_60_ = in_register_00001204;
  auVar23._0_4_ = cosTheta_i;
  auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23._0_16_);
  uVar1 = vcmpss_avx512f(auVar23._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_18._4_12_ = auVar15._4_12_;
  local_18._0_4_ = (uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar15._0_4_;
  fVar17 = (k->values).values[0];
  fVar5 = (k->values).values[1];
  fVar6 = (k->values).values[2];
  fVar7 = (k->values).values[3];
  fVar8 = (eta->values).values[0];
  fVar9 = (eta->values).values[1];
  fVar10 = (eta->values).values[2];
  fVar11 = (eta->values).values[3];
  auVar24._0_4_ = fVar8 * fVar8;
  auVar24._4_4_ = fVar9 * fVar9;
  auVar24._8_4_ = fVar10 * fVar10;
  auVar24._12_4_ = fVar11 * fVar11;
  auVar16._0_4_ = fVar17 * fVar17;
  auVar16._4_4_ = fVar5 * fVar5;
  auVar16._8_4_ = fVar6 * fVar6;
  auVar16._12_4_ = fVar7 * fVar7;
  auVar15 = vsubps_avx(auVar24,auVar16);
  local_48 = ZEXT416((uint)((float)local_18._0_4_ * (float)local_18._0_4_));
  fVar17 = 1.0 - (float)local_18._0_4_ * (float)local_18._0_4_;
  local_38 = ZEXT416((uint)fVar17);
  local_28._4_4_ = fVar17;
  local_28._0_4_ = fVar17;
  fStack_20 = fVar17;
  fStack_1c = fVar17;
  _local_58 = vsubps_avx(auVar15,_local_28);
  auVar15._8_4_ = 0x40800000;
  auVar15._0_8_ = 0x4080000040800000;
  auVar15._12_4_ = 0x40800000;
  auVar15 = vmulps_avx512vl(auVar24,auVar15);
  local_88._4_4_ = auVar16._4_4_ * auVar15._4_4_ + local_58._4_4_ * local_58._4_4_;
  local_88._0_4_ = auVar16._0_4_ * auVar15._0_4_ + local_58._0_4_ * local_58._0_4_;
  fStack_80 = auVar16._8_4_ * auVar15._8_4_ + local_58._8_4_ * local_58._8_4_;
  fStack_7c = auVar16._12_4_ * auVar15._12_4_ + local_58._12_4_ * local_58._12_4_;
  _local_98 = ZEXT416(0) << 0x20;
  lVar14 = 0;
  do {
    fVar17 = *(float *)(local_88 + lVar14 * 4);
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      auVar15 = vsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
      fVar17 = auVar15._0_4_;
    }
    *(float *)(local_98 + lVar14 * 4) = fVar17;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_68 = local_98;
  uStack_60 = 0;
  local_78 = uStack_90;
  uStack_70 = 0;
  auVar18._0_4_ = (float)local_58._0_4_ + (float)local_98._0_4_;
  auVar18._4_4_ = (float)local_58._4_4_ + (float)local_98._4_4_;
  auVar18._8_4_ = fStack_50 + (float)uStack_90;
  auVar18._12_4_ = fStack_4c + uStack_90._4_4_;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  _local_88 = vmulps_avx512vl(auVar18,auVar3);
  _local_98 = ZEXT816(0) << 0x20;
  lVar14 = 0;
  auVar23 = ZEXT1664(ZEXT816(0) << 0x40);
  do {
    auVar15 = vmaxss_avx(ZEXT416(*(uint *)(local_88 + lVar14 * 4)),auVar23._0_16_);
    if (auVar15._0_4_ < 0.0) {
      fVar17 = sqrtf(auVar15._0_4_);
      auVar23 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      fVar17 = auVar15._0_4_;
    }
    *(float *)(local_98 + lVar14 * 4) = fVar17;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  auVar13._8_8_ = uStack_60;
  auVar13._0_8_ = local_68;
  auVar12._8_8_ = uStack_70;
  auVar12._0_8_ = local_78;
  auVar16 = vunpcklpd_avx(auVar13,auVar12);
  auVar25._0_4_ = (float)local_48._0_4_ + auVar16._0_4_;
  auVar25._4_4_ = (float)local_48._0_4_ + auVar16._4_4_;
  auVar25._8_4_ = (float)local_48._0_4_ + auVar16._8_4_;
  auVar25._12_4_ = (float)local_48._0_4_ + auVar16._12_4_;
  local_18._0_4_ = (float)local_18._0_4_ + (float)local_18._0_4_;
  auVar27._0_4_ = (float)local_18._0_4_ * (float)local_98._0_4_;
  auVar27._4_4_ = (float)local_18._0_4_ * (float)local_98._4_4_;
  auVar27._8_4_ = (float)local_18._0_4_ * (float)uStack_90;
  auVar27._12_4_ = (float)local_18._0_4_ * uStack_90._4_4_;
  auVar15 = vsubps_avx(auVar25,auVar27);
  auVar26._0_4_ = auVar27._0_4_ + auVar25._0_4_;
  auVar26._4_4_ = auVar27._4_4_ + auVar25._4_4_;
  auVar26._8_4_ = auVar27._8_4_ + auVar25._8_4_;
  auVar26._12_4_ = auVar27._12_4_ + auVar25._12_4_;
  auVar15 = vdivps_avx(auVar15,auVar26);
  fVar17 = (float)local_38._0_4_ * (float)local_38._0_4_;
  auVar19._0_4_ = fVar17 + (float)local_48._0_4_ * auVar16._0_4_;
  auVar19._4_4_ = fVar17 + (float)local_48._0_4_ * auVar16._4_4_;
  auVar19._8_4_ = fVar17 + (float)local_48._0_4_ * auVar16._8_4_;
  auVar19._12_4_ = fVar17 + (float)local_48._0_4_ * auVar16._12_4_;
  auVar22._0_4_ = auVar27._0_4_ * (float)local_28._0_4_;
  auVar22._4_4_ = auVar27._4_4_ * (float)local_28._4_4_;
  auVar22._8_4_ = auVar27._8_4_ * fStack_20;
  auVar22._12_4_ = auVar27._12_4_ * fStack_1c;
  auVar16 = vsubps_avx(auVar19,auVar22);
  auVar28._0_4_ = auVar16._0_4_ * auVar15._0_4_;
  auVar28._4_4_ = auVar16._4_4_ * auVar15._4_4_;
  auVar28._8_4_ = auVar16._8_4_ * auVar15._8_4_;
  auVar28._12_4_ = auVar16._12_4_ * auVar15._12_4_;
  auVar20._0_4_ = auVar22._0_4_ + auVar19._0_4_;
  auVar20._4_4_ = auVar22._4_4_ + auVar19._4_4_;
  auVar20._8_4_ = auVar22._8_4_ + auVar19._8_4_;
  auVar20._12_4_ = auVar22._12_4_ + auVar19._12_4_;
  auVar16 = vdivps_avx(auVar28,auVar20);
  auVar21._0_4_ = auVar15._0_4_ + auVar16._0_4_;
  auVar21._4_4_ = auVar15._4_4_ + auVar16._4_4_;
  auVar21._8_4_ = auVar15._8_4_ + auVar16._8_4_;
  auVar21._12_4_ = auVar15._12_4_ + auVar16._12_4_;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar16 = vmulps_avx512vl(auVar21,auVar4);
  auVar15 = vshufpd_avx(auVar16,auVar16,1);
  SVar29.values.values._0_8_ = auVar16._0_8_;
  SVar29.values.values._8_8_ = auVar15._0_8_;
  return (SampledSpectrum)SVar29.values.values;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum FrConductor(Float cosTheta_i, const SampledSpectrum &eta,
                                   const SampledSpectrum &k) {
    cosTheta_i = Clamp(cosTheta_i, -1, 1);
    SampledSpectrum etak = k;

    Float cos2Theta_i = cosTheta_i * cosTheta_i;
    Float sin2Theta_i = 1 - cos2Theta_i;
    SampledSpectrum eta2 = eta * eta;
    SampledSpectrum etak2 = etak * etak;

    SampledSpectrum t0 = eta2 - etak2 - SampledSpectrum(sin2Theta_i);
    SampledSpectrum a2plusb2 = Sqrt(t0 * t0 + 4 * eta2 * etak2);
    SampledSpectrum t1 = a2plusb2 + SampledSpectrum(cos2Theta_i);
    SampledSpectrum a = SafeSqrt(0.5f * (a2plusb2 + t0));
    SampledSpectrum t2 = (Float)2 * cosTheta_i * a;
    SampledSpectrum Rs = (t1 - t2) / (t1 + t2);

    SampledSpectrum t3 =
        cos2Theta_i * a2plusb2 + SampledSpectrum(sin2Theta_i * sin2Theta_i);
    SampledSpectrum t4 = t2 * sin2Theta_i;
    SampledSpectrum Rp = Rs * (t3 - t4) / (t3 + t4);

    return 0.5f * (Rp + Rs);
}